

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TAPReporter::testRunStarting(TAPReporter *this,TestRunInfo *param_1)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  TestRunInfo *param_1_local;
  TAPReporter *this_local;
  
  iVar2 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xd])();
  bVar1 = TestSpec::hasFilters((TestSpec *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    poVar4 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                             "# filters: ");
    iVar2 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xd])();
    poVar4 = Catch::operator<<(poVar4,(TestSpec *)CONCAT44(extraout_var_00,iVar2));
    std::operator<<(poVar4,'\n');
  }
  poVar4 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                           "# rng-seed: ");
  uVar3 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0x11])();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
  std::operator<<(poVar4,'\n');
  return;
}

Assistant:

void TAPReporter::testRunStarting( TestRunInfo const& ) {
        if ( m_config->testSpec().hasFilters() ) {
            m_stream << "# filters: " << m_config->testSpec() << '\n';
        }
        m_stream << "# rng-seed: " << m_config->rngSeed() << '\n';
    }